

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trans_rvi.inc.c
# Opt level: O1

_Bool trans_srliw(DisasContext_conflict12 *ctx,arg_srliw *a)

{
  TCGContext_conflict11 *s;
  undefined1 extraout_AL;
  TCGTemp *a1;
  uintptr_t o;
  TCGv_i64 a2;
  uintptr_t o_1;
  TCGOpcode opc;
  uintptr_t o_2;
  TCGv_i64 ret;
  
  s = ctx->uc->tcg_ctx;
  a1 = tcg_temp_new_internal_riscv64(s,TCG_TYPE_I64,false);
  ret = (TCGv_i64)((long)a1 - (long)s);
  if ((long)a->rs1 == 0) {
    opc = INDEX_op_movi_i64;
    a2 = (TCGv_i64)0x0;
  }
  else {
    if (s->cpu_gpr[a->rs1] == ret) goto LAB_00c7af3f;
    a2 = s->cpu_gpr[a->rs1] + (long)s;
    opc = INDEX_op_mov_i64;
  }
  tcg_gen_op2_riscv64(s,opc,(TCGArg)a1,(TCGArg)a2);
LAB_00c7af3f:
  tcg_gen_extract_i64_riscv64(s,ret,ret,a->shamt,0x20 - a->shamt);
  tcg_gen_ext32s_i64_riscv64(s,ret,ret);
  if (((long)a->rd != 0) && (s->cpu_gpr[a->rd] != ret)) {
    tcg_gen_op2_riscv64(s,INDEX_op_mov_i64,(TCGArg)(s->cpu_gpr[a->rd] + (long)s),(TCGArg)a1);
  }
  tcg_temp_free_internal_riscv64(s,(TCGTemp *)(ret + (long)s));
  return (_Bool)extraout_AL;
}

Assistant:

static bool trans_srliw(DisasContext *ctx, arg_srliw *a)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    TCGv t = tcg_temp_new(tcg_ctx);
    gen_get_gpr(tcg_ctx, t, a->rs1);
    tcg_gen_extract_tl(tcg_ctx, t, t, a->shamt, 32 - a->shamt);
    /* sign-extend for W instructions */
    tcg_gen_ext32s_tl(tcg_ctx, t, t);
    gen_set_gpr(tcg_ctx, a->rd, t);
    tcg_temp_free(tcg_ctx, t);
    return true;
}